

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall glu::sl::ShaderParser::parseGLSLVersion(ShaderParser *this,GLSLVersion *version)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  GLSLVersion GVar3;
  string postfix;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
  assumeToken(this,TOKEN_INT_LITERAL);
  iVar1 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
  advanceToken(this);
  if (this->m_curToken == TOKEN_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)local_68);
    advanceToken(this);
  }
  if (0x149 < iVar1) {
    if (iVar1 < 0x1a4) {
      if (iVar1 == 0x14a) {
        GVar3 = GLSL_VERSION_330;
      }
      else if (iVar1 == 400) {
        GVar3 = GLSL_VERSION_400;
      }
      else {
        if (iVar1 != 0x19a) goto LAB_00a5bb87;
        GVar3 = GLSL_VERSION_410;
      }
    }
    else if (iVar1 < 0x1b8) {
      if (iVar1 == 0x1a4) {
        GVar3 = GLSL_VERSION_420;
      }
      else {
        if (iVar1 != 0x1ae) goto LAB_00a5bb87;
        GVar3 = GLSL_VERSION_430;
      }
    }
    else if (iVar1 == 0x1b8) {
      GVar3 = GLSL_VERSION_440;
    }
    else {
      if (iVar1 != 0x1c2) goto LAB_00a5bb87;
      GVar3 = GLSL_VERSION_450;
    }
    goto LAB_00a5bb61;
  }
  GVar3 = GLSL_VERSION_130;
  if (iVar1 < 0x96) {
    if (iVar1 == 100) {
      iVar2 = std::__cxx11::string::compare((char *)local_68);
      if (iVar2 == 0) {
        GVar3 = GLSL_VERSION_100_ES;
        goto LAB_00a5bb61;
      }
LAB_00a5b9ee:
      if (iVar1 == 0x82) goto LAB_00a5bb61;
      if (iVar1 != 0x8c) {
        if (iVar1 != 0x96) {
LAB_00a5bb87:
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Unknown GLSL version","");
          parseError(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
        }
        goto LAB_00a5bb5b;
      }
    }
    else {
      if (iVar1 == 0x82) goto LAB_00a5bb61;
      if (iVar1 != 0x8c) goto LAB_00a5bb87;
    }
    GVar3 = GLSL_VERSION_140;
  }
  else {
    if (0x135 < iVar1) {
      if (iVar1 != 0x136) {
        if ((iVar1 == 0x140) &&
           (iVar1 = std::__cxx11::string::compare((char *)local_68), iVar1 == 0)) {
          GVar3 = GLSL_VERSION_320_ES;
          goto LAB_00a5bb61;
        }
        goto LAB_00a5bb87;
      }
      iVar1 = std::__cxx11::string::compare((char *)local_68);
      if (iVar1 != 0) goto LAB_00a5bb87;
      GVar3 = GLSL_VERSION_310_ES;
      goto LAB_00a5bb61;
    }
    if (iVar1 != 0x96) {
      if (iVar1 != 300) goto LAB_00a5bb87;
      iVar2 = std::__cxx11::string::compare((char *)local_68);
      if (iVar2 == 0) {
        GVar3 = GLSL_VERSION_300_ES;
        goto LAB_00a5bb61;
      }
      goto LAB_00a5b9ee;
    }
LAB_00a5bb5b:
    GVar3 = GLSL_VERSION_150;
  }
LAB_00a5bb61:
  *version = GVar3;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void ShaderParser::parseGLSLVersion (glu::GLSLVersion& version)
{
	int			versionNum		= 0;
	std::string	postfix			= "";

	assumeToken(TOKEN_INT_LITERAL);
	versionNum = parseIntLiteral(m_curTokenStr.c_str());
	advanceToken();

	if (m_curToken == TOKEN_IDENTIFIER)
	{
		postfix = m_curTokenStr;
		advanceToken();
	}

	DE_STATIC_ASSERT(glu::GLSL_VERSION_LAST == 14);

	if		(versionNum == 100 && postfix == "es")	version = glu::GLSL_VERSION_100_ES;
	else if (versionNum == 300 && postfix == "es")	version = glu::GLSL_VERSION_300_ES;
	else if (versionNum == 310 && postfix == "es")	version = glu::GLSL_VERSION_310_ES;
	else if (versionNum == 320 && postfix == "es")	version = glu::GLSL_VERSION_320_ES;
	else if (versionNum == 130)						version = glu::GLSL_VERSION_130;
	else if (versionNum == 140)						version = glu::GLSL_VERSION_140;
	else if (versionNum == 150)						version = glu::GLSL_VERSION_150;
	else if (versionNum == 330)						version = glu::GLSL_VERSION_330;
	else if (versionNum == 400)						version = glu::GLSL_VERSION_400;
	else if (versionNum == 410)						version = glu::GLSL_VERSION_410;
	else if (versionNum == 420)						version = glu::GLSL_VERSION_420;
	else if (versionNum == 430)						version = glu::GLSL_VERSION_430;
	else if (versionNum == 440)						version = glu::GLSL_VERSION_440;
	else if (versionNum == 450)						version = glu::GLSL_VERSION_450;
	else
		parseError("Unknown GLSL version");
}